

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

size_t bsdtar_expand_char(char *buff,size_t offset,char c)

{
  ushort **ppuVar1;
  byte in_DL;
  long lVar2;
  long in_RSI;
  long in_RDI;
  size_t i;
  long local_20;
  
  ppuVar1 = __ctype_b_loc();
  if ((((*ppuVar1)[(int)(uint)in_DL] & 0x4000) == 0) || (in_DL == 0x5c)) {
    lVar2 = in_RSI + 1;
    *(undefined1 *)(in_RDI + in_RSI) = 0x5c;
    if (in_DL == 7) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x61;
    }
    else if (in_DL == 8) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x62;
    }
    else if (in_DL == 9) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x74;
    }
    else if (in_DL == 10) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x6e;
    }
    else if (in_DL == 0xb) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x76;
    }
    else if (in_DL == 0xc) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x66;
    }
    else if (in_DL == 0xd) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x72;
    }
    else if (in_DL == 0x5c) {
      local_20 = in_RSI + 2;
      *(undefined1 *)(in_RDI + lVar2) = 0x5c;
    }
    else {
      sprintf((char *)(in_RDI + lVar2),"%03o",(ulong)in_DL);
      local_20 = in_RSI + 4;
    }
  }
  else {
    local_20 = in_RSI + 1;
    *(byte *)(in_RDI + in_RSI) = in_DL;
  }
  return local_20 - in_RSI;
}

Assistant:

static size_t
bsdtar_expand_char(char *buff, size_t offset, char c)
{
	size_t i = offset;

	if (isprint((unsigned char)c) && c != '\\')
		buff[i++] = c;
	else {
		buff[i++] = '\\';
		switch (c) {
		case '\a': buff[i++] = 'a'; break;
		case '\b': buff[i++] = 'b'; break;
		case '\f': buff[i++] = 'f'; break;
		case '\n': buff[i++] = 'n'; break;
#if '\r' != '\n'
		/* On some platforms, \n and \r are the same. */
		case '\r': buff[i++] = 'r'; break;
#endif
		case '\t': buff[i++] = 't'; break;
		case '\v': buff[i++] = 'v'; break;
		case '\\': buff[i++] = '\\'; break;
		default:
			sprintf(buff + i, "%03o", 0xFF & (int)c);
			i += 3;
		}
	}

	return (i - offset);
}